

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<Fad<float>_>::ClassId(TPZMatrix<Fad<float>_> *this)

{
  uint uVar1;
  type tVar2;
  uint uVar3;
  string *in_stack_ffffffffffffffc0;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  TPZBaseMatrix *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  uVar1 = Hash(in_stack_ffffffffffffffc0);
  tVar2 = ClassIdOrHash<Fad<float>>();
  uVar3 = TPZBaseMatrix::ClassId(in_stack_ffffffffffffffe0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  return uVar1 ^ tVar2 * 2 ^ uVar3;
}

Assistant:

int TPZMatrix<TVar>::ClassId() const{
    return Hash("TPZMatrix") ^ ClassIdOrHash<TVar>()<<1 ^ TPZBaseMatrix::ClassId();
}